

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyTools.h
# Opt level: O2

void Assimp::NewellNormal<3,3,3,double>
               (aiVector3t<double> *out,int num,double *x,double *y,double *z)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = num * 3;
  x[iVar1] = *x;
  iVar3 = num * 3 + 3;
  x[iVar3] = x[3];
  y[iVar1] = *y;
  y[iVar3] = y[3];
  z[iVar1] = *z;
  iVar1 = 0;
  if (0 < num) {
    iVar1 = num;
  }
  z[iVar3] = z[3];
  dVar6 = 0.0;
  dVar7 = 0.0;
  dVar5 = 0.0;
  lVar2 = 0x18;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    dVar5 = dVar5 + (*(double *)((long)y + lVar2 + 0x18) - *(double *)((long)y + lVar2 + -0x18)) *
                    *(double *)((long)x + lVar2);
    dVar6 = dVar6 + *(double *)((long)y + lVar2) *
                    (*(double *)((long)z + lVar2 + 0x18) - *(double *)((long)z + lVar2 + -0x18));
    dVar7 = dVar7 + *(double *)((long)z + lVar2) *
                    (*(double *)((long)x + lVar2 + 0x18) - *(double *)((long)x + lVar2 + -0x18));
    lVar2 = lVar2 + 0x18;
  }
  out->x = dVar6;
  out->y = dVar7;
  out->z = dVar5;
  return;
}

Assistant:

inline void NewellNormal (aiVector3t<TReal>& out, int num, TReal* x, TReal* y, TReal* z)
{
    // Duplicate the first two vertices at the end
    x[(num+0)*ofs_x] = x[0];
    x[(num+1)*ofs_x] = x[ofs_x];

    y[(num+0)*ofs_y] = y[0];
    y[(num+1)*ofs_y] = y[ofs_y];

    z[(num+0)*ofs_z] = z[0];
    z[(num+1)*ofs_z] = z[ofs_z];

    TReal sum_xy = 0.0, sum_yz = 0.0, sum_zx = 0.0;

    TReal *xptr = x +ofs_x, *xlow = x, *xhigh = x + ofs_x*2;
    TReal *yptr = y +ofs_y, *ylow = y, *yhigh = y + ofs_y*2;
    TReal *zptr = z +ofs_z, *zlow = z, *zhigh = z + ofs_z*2;

    for (int tmp=0; tmp < num; tmp++) {
        sum_xy += (*xptr) * ( (*yhigh) - (*ylow) );
        sum_yz += (*yptr) * ( (*zhigh) - (*zlow) );
        sum_zx += (*zptr) * ( (*xhigh) - (*xlow) );

        xptr  += ofs_x;
        xlow  += ofs_x;
        xhigh += ofs_x;

        yptr  += ofs_y;
        ylow  += ofs_y;
        yhigh += ofs_y;

        zptr  += ofs_z;
        zlow  += ofs_z;
        zhigh += ofs_z;
    }
    out = aiVector3t<TReal>(sum_yz,sum_zx,sum_xy);
}